

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O0

ComponentPtr __thiscall libcellml::ComponentEntity::component(ComponentEntity *this,size_t index)

{
  ComponentEntityImpl *pCVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ComponentPtr CVar5;
  size_t index_local;
  ComponentEntity *this_local;
  ComponentPtr *component;
  
  std::shared_ptr<libcellml::Component>::shared_ptr
            ((shared_ptr<libcellml::Component> *)this,(nullptr_t)0x0);
  pCVar1 = pFunc((ComponentEntity *)index);
  sVar2 = std::
          vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
          ::size(&pCVar1->mComponents);
  _Var4._M_pi = extraout_RDX;
  if (in_RDX < sVar2) {
    pCVar1 = pFunc((ComponentEntity *)index);
    pvVar3 = std::
             vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             ::at(&pCVar1->mComponents,in_RDX);
    std::shared_ptr<libcellml::Component>::operator=
              ((shared_ptr<libcellml::Component> *)this,pvVar3);
    _Var4._M_pi = extraout_RDX_00;
  }
  CVar5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  CVar5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ComponentPtr)CVar5.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr ComponentEntity::component(size_t index) const
{
    ComponentPtr component = nullptr;
    if (index < pFunc()->mComponents.size()) {
        component = pFunc()->mComponents.at(index);
    }

    return component;
}